

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O0

void __thiscall Refal2::CUnit::Print(CUnit *this,ostream *outputStream,CPrintHelper *printHelper)

{
  TUnitType TVar1;
  TChar *pTVar2;
  ostream *poVar3;
  TNumber *pTVar4;
  uint *puVar5;
  CPrintHelper *printHelper_local;
  ostream *outputStream_local;
  CUnit *this_local;
  
  TVar1 = GetType(this);
  if (TVar1 == UT_Char) {
    poVar3 = std::operator<<(outputStream,"\'");
    pTVar2 = Char(this);
    poVar3 = std::operator<<(poVar3,*pTVar2);
    std::operator<<(poVar3,"\' ");
  }
  else if (TVar1 == UT_Label) {
    std::operator<<(outputStream,"/");
    puVar5 = (uint *)Label(this);
    (*printHelper->_vptr_CPrintHelper[1])(printHelper,outputStream,(ulong)*puVar5);
    std::operator<<(outputStream,"/ ");
  }
  else if (TVar1 == UT_Number) {
    poVar3 = std::operator<<(outputStream,"/");
    pTVar4 = Number(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pTVar4);
    std::operator<<(poVar3,"/ ");
  }
  else if (TVar1 == UT_Variable) {
    puVar5 = (uint *)Variable(this);
    (**printHelper->_vptr_CPrintHelper)(printHelper,outputStream,(ulong)*puVar5);
    std::operator<<(outputStream," ");
  }
  else if (TVar1 == UT_LeftParen) {
    std::operator<<(outputStream,"( ");
  }
  else if (TVar1 == UT_RightParen) {
    std::operator<<(outputStream,") ");
  }
  else if (TVar1 == UT_LeftBracket) {
    std::operator<<(outputStream,"< ");
  }
  else {
    if (TVar1 != UT_RightBracket) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                    ,0x59,"void Refal2::CUnit::Print(std::ostream &, const CPrintHelper &) const");
    }
    std::operator<<(outputStream,"> ");
  }
  return;
}

Assistant:

void CUnit::Print( std::ostream& outputStream,
	const CPrintHelper& printHelper ) const
{
	switch( GetType() ) {
		case UT_Char:
			outputStream << "'" << Char() << "' ";
			break;
		case UT_Label:
			outputStream << "/";
			printHelper.Label( outputStream, Label() );
			outputStream << "/ ";
			break;
		case UT_Number:
			outputStream << "/" << Number() << "/ ";
			break;
		case UT_Variable:
			printHelper.Variable( outputStream, Variable() );
			outputStream << " ";
			break;
		case UT_LeftParen:
			outputStream << "( ";
			break;
		case UT_RightParen:
			outputStream << ") ";
			break;
		case UT_LeftBracket:
			outputStream << "< ";
			break;
		case UT_RightBracket:
			outputStream << "> ";
			break;
		default:
			assert( false );
			break;
	}
}